

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

void __thiscall Js::CompoundString::AppendChars<int,Js::__4>(CompoundString *this,uint *value)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount CVar4;
  charcount_t cVar5;
  errno_t eVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  size_t sVar9;
  char16_t *pcVar10;
  uint uVar11;
  ulong val;
  char16_t *string;
  char16_t local_68 [4];
  char16 localConvertBuffer [21];
  
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00b4b429;
    *puVar8 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00b4b429;
    *puVar8 = 0;
  }
  bVar2 = HasOnlyDirectChars(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00b4b429;
    *puVar8 = 0;
  }
  CVar3 = LastBlockCharLength(this);
  CVar4 = LastBlockCharCapacity(this);
  if (CVar4 - CVar3 < 0xb) {
    string = local_68;
  }
  else {
    pcVar7 = LastBlockChars(this);
    string = pcVar7 + CVar3;
  }
  uVar11 = *value;
  val = (ulong)uVar11;
  if (val < 10) {
    string[0] = L'0';
    string[1] = L'0';
    string[2] = L'0';
LAB_00b4b2a1:
    string[3] = (ushort)uVar11 | 0x30;
    string[4] = L'\0';
  }
  else {
    if (uVar11 < 100) {
      string[0] = L'0';
      string[1] = L'0';
      string[2] = (ushort)(uVar11 / 10) | 0x30;
LAB_00b4b29a:
      uVar11 = uVar11 % 10;
      goto LAB_00b4b2a1;
    }
    if (uVar11 < 1000) {
      *string = L'0';
      string[1] = (ushort)(uVar11 / 100) | 0x30;
      string[2] = (short)(uVar11 / 10) + (short)((val / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      goto LAB_00b4b29a;
    }
    eVar6 = _ultow_s(val,(char16_t_conflict *)string,0xb,10);
    if (eVar6 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                  ,0x180,"(err == 0)","err == 0");
      if (!bVar2) goto LAB_00b4b429;
      *puVar8 = 0;
    }
  }
  sVar9 = PAL_wcslen(string);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
  uVar11 = (uint)sVar9;
  if (bVar2) {
    pcVar10 = L"";
    if (8 < uVar11) {
      pcVar10 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",string,pcVar10,sVar9 & 0xffffffff);
    Output::Flush();
  }
  if (CVar4 - CVar3 < 0xb) {
    if (string != local_68) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x50c,"(convertBuffer == localConvertBuffer)",
                                  "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_00b4b429:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    AppendGeneric<Js::CompoundString>(local_68,uVar11,this,true);
  }
  else {
    cVar5 = JavascriptString::GetLength((JavascriptString *)this);
    JavascriptString::SetLength((JavascriptString *)this,cVar5 + uVar11);
    SetLastBlockCharLength(this,CVar3 + uVar11);
  }
  return;
}

Assistant:

inline void CompoundString::AppendChars(
        const TValue &value,
        const CharCount maximumAppendCharLength,
        const FConvertToString ConvertToString)
    {
        AppendGeneric(value, maximumAppendCharLength, ConvertToString, this, true);
    }